

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O0

int coda_ascii_cursor_read_string(coda_cursor *cursor,char *dst,long dst_size)

{
  int iVar1;
  coda_type *local_58;
  int64_t local_50;
  int64_t bit_size_boundary;
  int64_t bit_size;
  int64_t read_size;
  int64_t bit_offset;
  coda_type *type;
  long dst_size_local;
  char *dst_local;
  coda_cursor *cursor_local;
  
  if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
    local_58 = (coda_type *)cursor->stack[cursor->n + -1].type;
  }
  else {
    local_58 = (cursor->stack[cursor->n + -1].type)->definition;
  }
  bit_offset = (int64_t)local_58;
  read_size = cursor->stack[cursor->n + -1].bit_offset;
  bit_size = 0;
  type = (coda_type *)dst_size;
  dst_size_local = (long)dst;
  dst_local = (char *)cursor;
  if ((read_size & 7U) != 0) {
    coda_set_error(-300,"product error detected (text does not start at byte boundary)");
    return -1;
  }
  if (local_58->bit_size < 0) {
    iVar1 = coda_ascii_cursor_get_bit_size(cursor,&bit_size_boundary);
    if (iVar1 != 0) {
      return -1;
    }
    if ((bit_size_boundary & 7U) != 0) {
      coda_set_error(-300,"product error detected (text does not have a rounded byte size)");
      return -1;
    }
  }
  else {
    iVar1 = get_bit_size_boundary(cursor,&local_50,local_58->bit_size);
    if (iVar1 != 0) {
      return -1;
    }
    bit_size_boundary = *(long *)(bit_offset + 0x20);
  }
  bit_size = bit_size_boundary >> 3;
  if ((long)type < bit_size + 1) {
    bit_size = (long)&type[-1].attributes + 7;
  }
  if (bit_size < 1) {
    *(undefined1 *)dst_size_local = 0;
  }
  else {
    iVar1 = read_bytes(*(coda_product **)dst_local,read_size >> 3,bit_size,(void *)dst_size_local);
    if (iVar1 != 0) {
      return -1;
    }
    *(undefined1 *)(dst_size_local + bit_size) = 0;
  }
  return 0;
}

Assistant:

int coda_ascii_cursor_read_string(const coda_cursor *cursor, char *dst, long dst_size)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    int64_t bit_offset = cursor->stack[cursor->n - 1].bit_offset;
    int64_t read_size = 0;

    if ((bit_offset & 0x7) != 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "product error detected (text does not start at byte boundary)");
        return -1;
    }
    if (type->bit_size < 0)
    {
        int64_t bit_size;

        if (coda_ascii_cursor_get_bit_size(cursor, &bit_size) != 0)
        {
            return -1;
        }
        if ((bit_size & 0x7) != 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "product error detected (text does not have a rounded byte size)");
            return -1;
        }
        read_size = bit_size >> 3;
    }
    else
    {
        int64_t bit_size_boundary;

        /* get_bit_size_boundary() will check that type->bit_size is within the expected boundaries */
        if (get_bit_size_boundary(cursor, &bit_size_boundary, type->bit_size) != 0)
        {
            return -1;
        }
        read_size = type->bit_size >> 3;
    }
    if (read_size + 1 > dst_size)       /* account for terminating zero */
    {
        read_size = dst_size - 1;
    }
    if (read_size > 0)
    {
        if (read_bytes(cursor->product, bit_offset >> 3, read_size, dst) != 0)
        {
            return -1;
        }
        dst[read_size] = '\0';
    }
    else
    {
        dst[0] = '\0';
    }

    return 0;
}